

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

int32 gauden_alloc_l_acc(gauden_t *g,uint32 n_lcl,int32 mean_reest,int32 var_reest,int32 fullvar)

{
  vector_t ***ppppfVar1;
  vector_t ****pppppfVar2;
  float32 ***pppfVar3;
  
  gauden_free_l_acc(g);
  if (mean_reest != 0) {
    if (g->l_macc != (vector_t ***)0x0) {
      __assert_fail("g->l_macc == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x28e,"int32 gauden_alloc_l_acc(gauden_t *, uint32, int32, int32, int32)");
    }
    ppppfVar1 = alloc_acc(g,n_lcl);
    g->l_macc = ppppfVar1;
  }
  if (var_reest != 0) {
    if (fullvar == 0) {
      if (g->l_vacc != (vector_t ***)0x0) {
        __assert_fail("g->l_vacc == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x298,"int32 gauden_alloc_l_acc(gauden_t *, uint32, int32, int32, int32)");
      }
      ppppfVar1 = alloc_acc(g,n_lcl);
      g->l_vacc = ppppfVar1;
    }
    else {
      if (g->l_fullvacc != (vector_t ****)0x0) {
        __assert_fail("g->l_fullvacc == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                      ,0x294,"int32 gauden_alloc_l_acc(gauden_t *, uint32, int32, int32, int32)");
      }
      pppppfVar2 = alloc_acc_full(g,n_lcl);
      g->l_fullvacc = pppppfVar2;
    }
  }
  if (var_reest != 0 || mean_reest != 0) {
    if (g->l_dnom != (float32 ***)0x0) {
      __assert_fail("g->l_dnom == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x29e,"int32 gauden_alloc_l_acc(gauden_t *, uint32, int32, int32, int32)");
    }
    pppfVar3 = (float32 ***)
               __ckd_calloc_3d__((ulong)n_lcl,(ulong)g->n_feat,(ulong)g->n_density,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                 ,0x2a2);
    g->l_dnom = pppfVar3;
  }
  return 0;
}

Assistant:

int32
gauden_alloc_l_acc(gauden_t *g, uint32 n_lcl,
		   int32 mean_reest,
		   int32 var_reest,
		   int32 fullvar)
{
    /* free any local accumulators from the prior utterance */
    gauden_free_l_acc(g);

    if (mean_reest) {
	/* allocate mean accumulators */
	assert(g->l_macc == NULL);
	g->l_macc = alloc_acc(g, n_lcl);
    }
    if (var_reest) {
	/* allocate variance accumulators */
	if (fullvar) {
	    assert(g->l_fullvacc == NULL);
	    g->l_fullvacc = alloc_acc_full(g, n_lcl);
	}
	else {
	    assert(g->l_vacc == NULL);
	    g->l_vacc = alloc_acc(g, n_lcl);
	}
    }
    if (mean_reest || var_reest) {
	/* allocate mean/var normalization accumulators */
	assert(g->l_dnom == NULL);
	g->l_dnom = (float32  ***) ckd_calloc_3d(n_lcl,
						 g->n_feat,
						 g->n_density,
						 sizeof(float32));
    }

    return S3_SUCCESS;
}